

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O0

C_matrix<double> * __thiscall
C_matrix<double>::operator=
          (C_matrix<double> *__return_storage_ptr__,C_matrix<double> *this,C_matrix<double> *c)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  ushort local_24;
  ushort local_22;
  unsigned_short j;
  unsigned_short i;
  C_matrix<double> *c_local;
  C_matrix<double> *this_local;
  
  if (this == c) {
    C_matrix(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  iVar2 = getNbColumn(c);
  iVar3 = getNbColumn(this);
  if (iVar2 == iVar3) {
    iVar2 = getNbRow(c);
    iVar3 = getNbRow(this);
    if (iVar2 == iVar3) goto LAB_0011f57e;
  }
  iVar2 = getNbRow(c);
  iVar3 = getNbColumn(c);
  resize(this,iVar2,iVar3);
LAB_0011f57e:
  for (local_22 = 0; (int)(uint)local_22 < this->m_L; local_22 = local_22 + 1) {
    for (local_24 = 0; (int)(uint)local_24 < this->m_C; local_24 = local_24 + 1) {
      pdVar4 = operator()(c,local_22,local_24);
      dVar1 = *pdVar4;
      pdVar4 = this->m_A;
      iVar2 = getIndex(this,(uint)local_22,(uint)local_24);
      pdVar4[iVar2] = dVar1;
    }
  }
  C_matrix(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

C_matrix<dataType> C_matrix<dataType>::operator= (C_matrix const& c)
{
    if(this==&c)return *this;

    if(c.getNbColumn()!=this->getNbColumn() || c.getNbRow()!=this->getNbRow())
    {
        this->resize(c.getNbRow(),c.getNbColumn());
        //throw "dimension matrix must agree";
    }

    for(unsigned short i=0 ; i<this->m_L ; i++)
    {
        for(unsigned short j=0 ; j<this->m_C ; j++)
        {
            this->m_A[getIndex(i,j)] = c(i,j);
        }
    }
    return *this;
}